

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CClient.cpp
# Opt level: O2

ssize_t __thiscall CClient::sendErrorMsg(CClient *this)

{
  ssize_t sVar1;
  string ret;
  allocator local_29;
  string local_28;
  
  if ((int)this->m_State < 2) {
    std::__cxx11::string::string
              ((string *)&local_28,"530 Please login with USER and PASS.\r\n",&local_29);
    sVar1 = sendMsg(this,&local_28);
  }
  else {
    std::__cxx11::string::string((string *)&local_28,"500 Unknown command.\r\n",&local_29);
    sVar1 = sendMsg(this,&local_28);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return sVar1;
}

Assistant:

ssize_t CClient::sendErrorMsg() {
    if(m_State < USER){
        string ret = "530 Please login with USER and PASS.\r\n";
        return sendMsg(ret);
    }
    else{
        string ret = "500 Unknown command.\r\n";
        return sendMsg(ret);
    }
}